

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O1

bool arangodb::velocypack::Collection::all(Slice slice,Predicate *predicate)

{
  ValueLength VVar1;
  ValueLength VVar2;
  char cVar3;
  long lVar4;
  Slice s;
  ArrayIterator it;
  uint8_t *local_60;
  long local_58;
  ArrayIterator local_50;
  
  ArrayIterator::ArrayIterator(&local_50,slice);
  lVar4 = 0;
  while (VVar2 = local_50._position, VVar1 = local_50._size, local_50._position != local_50._size) {
    local_60 = (uint8_t *)ArrayIterator::value(&local_50);
    local_58 = lVar4;
    if (*(long *)(predicate + 0x10) == 0) {
      std::__throw_bad_function_call();
    }
    cVar3 = (**(code **)(predicate + 0x18))(predicate,&local_60,&local_58);
    if (cVar3 == '\0') break;
    ArrayIterator::next(&local_50);
    lVar4 = lVar4 + 1;
  }
  return VVar2 == VVar1;
}

Assistant:

bool Collection::all(Slice slice, Predicate const& predicate) {
  ArrayIterator it(slice);
  ValueLength index = 0;

  while (it.valid()) {
    Slice s = it.value();
    if (!predicate(s, index)) {
      return false;
    }
    it.next();
    ++index;
  }

  return true;
}